

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i)

{
  int iVar1;
  ogg_int64_t oVar2;
  ogg_int64_t oVar3;
  int i_00;
  
  oVar3 = -0x83;
  if (((1 < vf->ready_state) && (vf->seekable != 0)) && (iVar1 = vf->links, i < iVar1)) {
    if (i < 0) {
      i_00 = 0;
      oVar3 = 0;
      if (0 < iVar1) {
        do {
          oVar2 = ov_pcm_total(vf,i_00);
          oVar3 = oVar3 + oVar2;
          i_00 = i_00 + 1;
        } while (iVar1 != i_00);
      }
    }
    else {
      oVar3 = vf->pcmlengths[(ulong)(uint)(i * 2) + 1];
    }
  }
  return oVar3;
}

Assistant:

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable || i>=vf->links)return(OV_EINVAL);
  if(i<0){
    ogg_int64_t acc=0;
    int i;
    for(i=0;i<vf->links;i++)
      acc+=ov_pcm_total(vf,i);
    return(acc);
  }else{
    return(vf->pcmlengths[i*2+1]);
  }
}